

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_buffer_compressor_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::ZLIBBufferCompressorTest_test_different_size_buffers_buffer_Test::TestBody
          (ZLIBBufferCompressorTest_test_different_size_buffers_buffer_Test *this)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  byte local_31;
  undefined1 local_30 [7];
  uchar j;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  size_t i;
  ZLIBBufferCompressorTest_test_different_size_buffers_buffer_Test *this_local;
  
  for (buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage < (pointer)0x100;
      buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    for (local_31 = 0;
        (pointer)(ulong)local_31 <
        buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage; local_31 = local_31 + 1) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_30,&local_31);
    }
    ZLIBBufferCompressorTest::TestCompression
              (&local_60,&this->super_ZLIBBufferCompressorTest,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0x10000);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_60);
    ZLIBBufferCompressorTest::TestCompression
              (&local_78,&this->super_ZLIBBufferCompressorTest,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_78);
    ZLIBBufferCompressorTest::TestCompression
              (&local_90,&this->super_ZLIBBufferCompressorTest,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0x10000);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_90);
    ZLIBBufferCompressorTest::TestCompression
              (&local_a8,&this->super_ZLIBBufferCompressorTest,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0x10000);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_a8);
    ZLIBBufferCompressorTest::TestCompression
              (&local_c0,&this->super_ZLIBBufferCompressorTest,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0x10000);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_c0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  }
  return;
}

Assistant:

TEST_F(ZLIBBufferCompressorTest, test_different_size_buffers_buffer)
{
    for (size_t i = 0; i < 256; i++)
    {
        std::vector<unsigned char> buffer;
        for (unsigned char j = 0; j < i; j++)
        {
            buffer.emplace_back(j);
        }
        TestCompression(buffer, 65536);
        TestCompression(buffer, 8);
        TestCompression(buffer, 65536);
        TestCompression(buffer, 65536);
        TestCompression(buffer, 65536);
    }
}